

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::SharedCtor
          (UniDirectionalLSTMLayerParams *this)

{
  this->inputvectorsize_ = 0;
  this->outputvectorsize_ = 0;
  this->params_ = (LSTMParams *)0x0;
  this->weightparams_ = (LSTMWeightParams *)0x0;
  this->reverseinput_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::SharedCtor() {
  ::memset(&params_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&params_) + sizeof(reverseinput_));
  _cached_size_ = 0;
}